

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall
Clasp::Solver::resolveToFlagged(Solver *this,LitVec *in,uint8 vf,LitVec *out,uint32 *outLbd)

{
  uint uVar1;
  Literal p;
  pointer pLVar2;
  pointer puVar3;
  SolverStrategies SVar4;
  CCMinRecursive *pCVar5;
  pointer pDVar6;
  byte bVar7;
  bool bVar8;
  byte bVar9;
  uint32 uVar10;
  size_type sVar11;
  ulong uVar12;
  int iVar13;
  undefined7 in_register_00000011;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  bool bVar21;
  LitVec temp;
  Literal local_54;
  LitVec *local_50;
  LitVec local_48;
  uint32 *local_38;
  
  local_38 = outLbd;
  local_48.ebo_.buf = (pointer)0x0;
  local_48.ebo_.size = 0;
  local_48.ebo_.cap = 0;
  (out->ebo_).size = 0;
  uVar14 = (this->assign_).trail.ebo_.size;
  bVar8 = true;
  bVar7 = 0;
  iVar13 = 0;
  do {
    bVar9 = bVar7;
    uVar12 = (ulong)(in->ebo_).size;
    uVar15 = (uint)CONCAT71(in_register_00000011,vf);
    if (uVar12 != 0) {
      pLVar2 = (in->ebo_).buf;
      lVar20 = 0;
      local_50 = in;
      do {
        uVar1 = *(uint *)((long)&pLVar2->rep_ + lVar20);
        puVar3 = (this->assign_).assign_.ebo_.buf;
        uVar19 = *(uint *)((long)puVar3 + (ulong)(uVar1 & 0xfffffffc));
        if ((uVar19 & 0xc) == 0) {
          uVar16 = uVar1 >> 2;
          puVar3[uVar16] = uVar19 | 0xc;
          uVar17 = 0;
          if (uVar16 < (this->shared_->varInfo_).ebo_.size) {
            uVar17 = (uint)(this->shared_->varInfo_).ebo_.buf[uVar16].rep;
          }
          if ((uVar15 & ~uVar17) == 0) {
            local_54.rep_ = uVar1 & 0xfffffffe ^ (uint)bVar9 * 2;
            pDVar6 = (this->levels_).super_type.ebo_.buf + ((uVar19 >> 4) - 1);
            *(uint *)pDVar6 = *(uint *)pDVar6 | 0x40000000;
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      (out,&local_54);
          }
          else {
            if ((this->assign_).reason_.super_type.ebo_.buf[uVar16].data_ == 0) {
              puVar3[uVar16] = uVar19;
              bVar8 = false;
              in = local_50;
              break;
            }
            iVar13 = iVar13 + 1;
          }
        }
        lVar20 = lVar20 + 4;
        in = local_50;
      } while (uVar12 << 2 != lVar20);
    }
    if (iVar13 != 0) {
      puVar3 = (this->assign_).assign_.ebo_.buf;
      do {
        do {
          uVar14 = uVar14 - 1;
          p.rep_ = (this->assign_).trail.ebo_.buf[uVar14].rep_;
          uVar1 = *(uint *)((long)puVar3 + (ulong)(p.rep_ & 0xfffffffc));
        } while (((p.rep_ & 2) * 2 + 4 & uVar1) == 0);
        uVar19 = p.rep_ >> 2;
        uVar16 = 0;
        if (uVar19 < (this->shared_->varInfo_).ebo_.size) {
          uVar16 = (uint)(this->shared_->varInfo_).ebo_.buf[uVar19].rep;
        }
      } while ((uVar15 & ~uVar16) == 0);
      puVar3[uVar19] = uVar1 & 0xfffffff3;
      local_48.ebo_._8_8_ = local_48.ebo_._8_8_ & 0xffffffff00000000;
      in = &local_48;
      Antecedent::reason((this->assign_).reason_.super_type.ebo_.buf + uVar19,this,p,in);
    }
    bVar21 = iVar13 == 0;
    bVar7 = 1;
    iVar13 = iVar13 + -1;
    if (bVar21) {
      uVar14 = (out->ebo_).size;
      uVar12 = (ulong)uVar14;
      if ((bVar9 & bVar8) != 0) {
        SVar4 = this->strategy_;
        pCVar5 = this->ccMin_;
        this->strategy_ = (SolverStrategies)((ulong)SVar4 | 0x400000000000);
        if (pCVar5 != (CCMinRecursive *)0x0) {
          uVar10 = incEpoch(this,(this->assign_).assign_.ebo_.size,2);
          pCVar5->open = uVar10 - 2;
        }
        if (uVar14 != 0) {
          uVar15 = 0;
          do {
            bVar21 = ccRemovable(this,(Literal)((out->ebo_).buf[uVar15].rep_ & 0xfffffffe ^ 2),0,
                                 this->ccMin_);
            if (bVar21) {
              pLVar2 = (out->ebo_).buf;
              uVar12 = (ulong)((int)uVar12 - 1);
              uVar10 = pLVar2[uVar15].rep_;
              pLVar2[uVar15].rep_ = pLVar2[uVar12].rep_;
              pLVar2[uVar12].rep_ = uVar10;
            }
            else {
              uVar15 = uVar15 + 1;
            }
            uVar14 = (uint)uVar12;
          } while (uVar15 != uVar14);
        }
        this->strategy_ =
             (SolverStrategies)
             ((ulong)this->strategy_ & 0xffffbfffffffffff | (ulong)SVar4 & 0x400000000000);
      }
      if (uVar14 != 0 || (~bVar8 & 1U) != 0) {
        *local_38 = 0;
        if (uVar14 != 0) {
          uVar12 = 0;
          iVar13 = 0;
          do {
            puVar3 = (this->assign_).assign_.ebo_.buf;
            uVar18 = (ulong)((out->ebo_).buf[uVar12].rep_ & 0xfffffffc);
            uVar15 = *(uint *)((long)puVar3 + uVar18);
            *(uint *)((long)puVar3 + uVar18) = uVar15 & 0xfffffff3;
            if (0xf < uVar15) {
              uVar15 = uVar15 >> 4;
              pDVar6 = (this->levels_).super_type.ebo_.buf;
              uVar1 = *(uint *)(pDVar6 + (uVar15 - 1));
              if ((uVar1 >> 0x1e & 1) != 0) {
                *(uint *)(pDVar6 + (uVar15 - 1)) = uVar1 & 0xbfffffff;
                uVar1 = (this->levels_).root;
                bVar21 = iVar13 == 0;
                iVar13 = iVar13 + (uint)(uVar15 <= uVar1);
                *local_38 = *local_38 + (uint)(bVar21 || uVar1 < uVar15);
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar14 != uVar12);
        }
        sVar11 = (out->ebo_).size;
        while (uVar14 != sVar11) {
          puVar3 = (this->assign_).assign_.ebo_.buf;
          uVar12 = (ulong)((out->ebo_).buf[sVar11 - 1].rep_ & 0xfffffffc);
          uVar15 = *(uint *)((long)puVar3 + uVar12);
          *(uint *)((long)puVar3 + uVar12) = uVar15 & 0xfffffff3;
          pDVar6 = (this->levels_).super_type.ebo_.buf + ((uVar15 >> 4) - 1);
          *(uint *)pDVar6 = *(uint *)pDVar6 & 0xbfffffff;
          sVar11 = (out->ebo_).size - 1;
          (out->ebo_).size = sVar11;
        }
        if (local_48.ebo_.buf != (pointer)0x0) {
          operator_delete(local_48.ebo_.buf);
        }
        return bVar8;
      }
      Potassco::fail(-1,
                     "bool Clasp::Solver::resolveToFlagged(const LitVec &, const uint8, LitVec &, uint32 &)"
                     ,0x48a,"!ok || outSize != 0","Invalid empty clause - was %u!\n",
                     (ulong)(out->ebo_).size,0);
    }
  } while( true );
}

Assistant:

bool Solver::resolveToFlagged(const LitVec& in, const uint8 vf, LitVec& out, uint32& outLbd) {
	const LitVec& trail = assign_.trail;
	const LitVec* rhs   = &in;
	LitVec temp; out.clear();
	bool ok = true, first = true;
	for (LitVec::size_type tp = trail.size(), resolve = 0;; first = false) {
		Literal p; Var v;
		for (LitVec::const_iterator it = rhs->begin(), end = rhs->end(); it != end; ++it) {
			p = *it ^ first; v = p.var();
			if (!seen(v)) {
				markSeen(v);
				if      (varInfo(v).hasAll(vf)) { markLevel(level(v)); out.push_back(~p); }
				else if (!reason(p).isNull())   { ++resolve; }
				else                            { clearSeen(v); ok = false; break; }
			}
		}
		if (resolve-- == 0) { break; }
		// find next literal to resolve
		while (!seen(trail[--tp]) || varInfo(trail[tp].var()).hasAll(vf)) { ; }
		clearSeen((p = trail[tp]).var());
		reason(p, temp);
		rhs = &temp;
	}
	LitVec::size_type outSize = out.size();
	if (ok && !first) {
		const uint32 ccAct = strategy_.ccMinKeepAct;
		const uint32 antes = SolverStrategies::all_antes;
		strategy_.ccMinKeepAct = 1;
		if (ccMin_) { ccMinRecurseInit(*ccMin_); }
		for (LitVec::size_type i = 0; i != outSize;) {
			if (!ccRemovable(~out[i], antes, ccMin_)) { ++i; }
			else {
				std::swap(out[i], out[--outSize]);
			}
		}
		strategy_.ccMinKeepAct = ccAct;
	}
	POTASSCO_ASSERT(!ok || outSize != 0, "Invalid empty clause - was %u!\n", out.size());
	outLbd = 0;
	for (uint32 i = 0, dl, root = 0; i != outSize; ++i) {
		Var v = out[i].var();
		dl    = level(v);
		clearSeen(v);
		if (dl && hasLevel(dl)) {
			unmarkLevel(dl);
			outLbd += (dl > rootLevel()) || (++root == 1);
		}
	}
	for (Var v; outSize != out.size(); out.pop_back()) {
		clearSeen(v = out.back().var());
		unmarkLevel(level(v));
	}
	return ok;
}